

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbuffer.h
# Opt level: O0

int msgpack_sbuffer_write(void *data,char *buf,size_t len)

{
  bool bVar1;
  void *pvVar2;
  size_t local_50;
  size_t tmp_nsize;
  size_t nsize;
  void *tmp;
  msgpack_sbuffer *sbuf;
  size_t len_local;
  char *buf_local;
  void *data_local;
  
  if ((ulong)(*(long *)((long)data + 0x10) - *data) < len) {
    if (*(long *)((long)data + 0x10) == 0) {
      local_50 = 0x2000;
    }
    else {
      local_50 = *(long *)((long)data + 0x10) << 1;
    }
    tmp_nsize = local_50;
    do {
      if (*data + len <= tmp_nsize) goto LAB_00211ab8;
      bVar1 = tmp_nsize < tmp_nsize << 1;
      tmp_nsize = tmp_nsize << 1;
    } while (bVar1);
    tmp_nsize = *data + len;
LAB_00211ab8:
    pvVar2 = realloc(*(void **)((long)data + 8),tmp_nsize);
    if (pvVar2 == (void *)0x0) {
      return -1;
    }
    *(void **)((long)data + 8) = pvVar2;
    *(size_t *)((long)data + 0x10) = tmp_nsize;
  }
  memcpy((void *)(*(long *)((long)data + 8) + *data),buf,len);
  *(size_t *)data = len + *data;
  return 0;
}

Assistant:

static inline int msgpack_sbuffer_write(void* data, const char* buf, size_t len)
{
    msgpack_sbuffer* sbuf = (msgpack_sbuffer*)data;

    if(sbuf->alloc - sbuf->size < len) {
        void* tmp;
        size_t nsize = (sbuf->alloc) ?
                sbuf->alloc * 2 : MSGPACK_SBUFFER_INIT_SIZE;

        while(nsize < sbuf->size + len) {
            size_t tmp_nsize = nsize * 2;
            if (tmp_nsize <= nsize) {
                nsize = sbuf->size + len;
                break;
            }
            nsize = tmp_nsize;
        }

        tmp = realloc(sbuf->data, nsize);
        if(!tmp) { return -1; }

        sbuf->data = (char*)tmp;
        sbuf->alloc = nsize;
    }

    memcpy(sbuf->data + sbuf->size, buf, len);
    sbuf->size += len;
    return 0;
}